

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytesinkutil.cpp
# Opt level: O0

UBool icu_63::ByteSinkUtil::appendUnchanged
                (uint8_t *s,uint8_t *limit,ByteSink *sink,uint32_t options,Edits *edits,
                UErrorCode *errorCode)

{
  UBool UVar1;
  int length_00;
  int32_t length;
  UErrorCode *errorCode_local;
  Edits *edits_local;
  uint32_t options_local;
  ByteSink *sink_local;
  uint8_t *limit_local;
  uint8_t *s_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((long)limit - (long)s < 0x80000000) {
      length_00 = (int)limit - (int)s;
      if (0 < length_00) {
        appendNonEmptyUnchanged(s,length_00,sink,options,edits);
      }
      s_local._7_1_ = '\x01';
    }
    else {
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      s_local._7_1_ = '\0';
    }
  }
  else {
    s_local._7_1_ = '\0';
  }
  return s_local._7_1_;
}

Assistant:

UBool
ByteSinkUtil::appendUnchanged(const uint8_t *s, const uint8_t *limit,
                              ByteSink &sink, uint32_t options, Edits *edits,
                              UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return FALSE; }
    if ((limit - s) > INT32_MAX) {
        errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    }
    int32_t length = (int32_t)(limit - s);
    if (length > 0) {
        appendNonEmptyUnchanged(s, length, sink, options, edits);
    }
    return TRUE;
}